

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void MergeUVPlane(uint8_t *src_u,int src_stride_u,uint8_t *src_v,int src_stride_v,uint8_t *dst_uv,
                 int dst_stride_uv,int width,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *MergeUVRow;
  int y;
  code *local_38;
  int local_30;
  long local_28;
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  local_38 = MergeUVRow_C;
  local_28 = in_R8;
  if ((int)dst_uv < 0) {
    dst_uv._0_4_ = -(int)dst_uv;
    local_28 = in_R8 + ((int)dst_uv + -1) * in_R9D;
    in_R9D = -in_R9D;
  }
  local_1c = in_ECX;
  local_c = in_ESI;
  if (((in_ESI == y) && (in_ECX == y)) && (in_R9D == y * 2)) {
    y = (int)dst_uv * y;
    dst_uv._0_4_ = 1;
    in_R9D = 0;
    local_1c = 0;
    local_c = 0;
  }
  iVar1 = libyuv::TestCpuFlag(in_R9D);
  if ((iVar1 != 0) && (local_38 = MergeUVRow_Any_SSE2, (y & 0xfU) == 0)) {
    local_38 = MergeUVRow_SSE2;
  }
  iVar1 = libyuv::TestCpuFlag(in_R9D);
  if ((iVar1 != 0) && (local_38 = MergeUVRow_Any_AVX2, (y & 0x1fU) == 0)) {
    local_38 = MergeUVRow_AVX2;
  }
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < (int)dst_uv; local_30 = local_30 + 1) {
    (*local_38)(local_8,local_18,local_28,y);
    local_8 = local_8 + local_c;
    local_18 = local_18 + local_1c;
    local_28 = local_28 + in_R9D;
  }
  return;
}

Assistant:

LIBYUV_API
void MergeUVPlane(const uint8_t* src_u,
                  int src_stride_u,
                  const uint8_t* src_v,
                  int src_stride_v,
                  uint8_t* dst_uv,
                  int dst_stride_uv,
                  int width,
                  int height) {
  int y;
  void (*MergeUVRow)(const uint8_t* src_u, const uint8_t* src_v,
                     uint8_t* dst_uv, int width) = MergeUVRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_uv = dst_uv + (height - 1) * dst_stride_uv;
    dst_stride_uv = -dst_stride_uv;
  }
  // Coalesce rows.
  if (src_stride_u == width && src_stride_v == width &&
      dst_stride_uv == width * 2) {
    width *= height;
    height = 1;
    src_stride_u = src_stride_v = dst_stride_uv = 0;
  }
#if defined(HAS_MERGEUVROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    MergeUVRow = MergeUVRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      MergeUVRow = MergeUVRow_SSE2;
    }
  }
#endif
#if defined(HAS_MERGEUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    MergeUVRow = MergeUVRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      MergeUVRow = MergeUVRow_AVX2;
    }
  }
#endif
#if defined(HAS_MERGEUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    MergeUVRow = MergeUVRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      MergeUVRow = MergeUVRow_NEON;
    }
  }
#endif
#if defined(HAS_MERGEUVROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    MergeUVRow = MergeUVRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      MergeUVRow = MergeUVRow_MMI;
    }
  }
#endif
#if defined(HAS_MERGEUVROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    MergeUVRow = MergeUVRow_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      MergeUVRow = MergeUVRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    // Merge a row of U and V into a row of UV.
    MergeUVRow(src_u, src_v, dst_uv, width);
    src_u += src_stride_u;
    src_v += src_stride_v;
    dst_uv += dst_stride_uv;
  }
}